

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes ReadBitVector(CSzData *sd,UInt32 numItems,Byte **v,ISzAlloc *alloc)

{
  uint uVar1;
  Byte *pBVar2;
  sbyte sVar3;
  uint numBits;
  UInt32 numBytes;
  Byte *v2;
  Byte allAreDefined;
  ISzAlloc *alloc_local;
  Byte **v_local;
  UInt32 numItems_local;
  CSzData *sd_local;
  
  uVar1 = numItems + 7 >> 3;
  *v = (Byte *)0x0;
  if (sd->Size == 0) {
    sd_local._4_4_ = 0x10;
  }
  else {
    sd->Size = sd->Size - 1;
    pBVar2 = sd->Data;
    sd->Data = pBVar2 + 1;
    if (uVar1 == 0) {
      sd_local._4_4_ = 0;
    }
    else if (*pBVar2 == '\0') {
      if (sd->Size < (ulong)uVar1) {
        sd_local._4_4_ = 0x10;
      }
      else {
        pBVar2 = (Byte *)(*alloc->Alloc)(alloc,0);
        *v = pBVar2;
        if (pBVar2 == (Byte *)0x0) {
          sd_local._4_4_ = 2;
        }
        else {
          memcpy(*v,sd->Data,(ulong)uVar1);
          sd->Size = sd->Size - (ulong)uVar1;
          sd->Data = sd->Data + uVar1;
          sd_local._4_4_ = 0;
        }
      }
    }
    else {
      pBVar2 = (Byte *)(*alloc->Alloc)(alloc,0);
      *v = pBVar2;
      if (pBVar2 == (Byte *)0x0) {
        sd_local._4_4_ = 2;
      }
      else {
        pBVar2 = *v;
        memset(pBVar2,0xff,(ulong)uVar1);
        if ((numItems & 7) != 0) {
          sVar3 = (sbyte)(numItems & 7);
          pBVar2[uVar1 - 1] = (Byte)((1 << sVar3) + -1 << (8U - sVar3 & 0x1f));
        }
        sd_local._4_4_ = 0;
      }
    }
  }
  return sd_local._4_4_;
}

Assistant:

static MY_NO_INLINE SRes ReadBitVector(CSzData *sd, UInt32 numItems, Byte **v, ISzAlloc *alloc)
{
  Byte allAreDefined;
  Byte *v2;
  UInt32 numBytes = (numItems + 7) >> 3;
  *v = NULL;
  SZ_READ_BYTE(allAreDefined);
  if (numBytes == 0)
    return SZ_OK;
  if (allAreDefined == 0)
  {
    if (numBytes > sd->Size)
      return SZ_ERROR_ARCHIVE;
    MY_ALLOC_AND_CPY(*v, numBytes, sd->Data, alloc);
    SKIP_DATA(sd, numBytes);
    return SZ_OK;
  }
  MY_ALLOC(Byte, *v, numBytes, alloc);
  v2 = *v;
  memset(v2, 0xFF, (size_t)numBytes);
  {
    unsigned numBits = (unsigned)numItems & 7;
    if (numBits != 0)
      v2[numBytes - 1] = (Byte)((((UInt32)1 << numBits) - 1) << (8 - numBits));
  }
  return SZ_OK;
}